

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GridDataType1::GridDataType1
          (GridDataType1 *this,KUINT16 SampleType,KFLOAT32 FieldScale,KFLOAT32 FieldOffset,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *Values)

{
  GridData::GridData(&this->super_GridData);
  (this->super_GridData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridDataType1_0022cd80;
  *(KFLOAT32 *)&(this->super_GridData).field_0xc = FieldScale;
  this->m_f32FieldOffset = FieldOffset;
  this->m_ui16NumValues =
       (KUINT16)((uint)(*(int *)&(Values->
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                       *(int *)&(Values->
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)
                                ._M_impl.super__Vector_impl_data._M_start) >> 1);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_vui16Values,Values);
  this->m_ui16Padding = 0;
  (this->super_GridData).m_ui16SmpTyp = SampleType;
  (this->super_GridData).m_ui16DtRep = 1;
  return;
}

Assistant:

GridDataType1::GridDataType1( KUINT16 SampleType, KFLOAT32 FieldScale, KFLOAT32 FieldOffset,
                              const std::vector<KUINT16> & Values ) :
    m_f32FieldScale( FieldScale ),
    m_f32FieldOffset( FieldOffset ),
    m_ui16NumValues( Values.size() ),
    m_vui16Values( Values ),
    m_ui16Padding( 0 )
{
    m_ui16SmpTyp = SampleType;
    m_ui16DtRep = Type1;
}